

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIncludeCommand.cxx
# Opt level: O2

bool cmIncludeCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  pointer pbVar2;
  cmMakefile *pcVar3;
  cmExecutionStatus *pcVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  PolicyStatus PVar9;
  int iVar10;
  mapped_type *pmVar11;
  undefined7 extraout_var;
  iterator iVar12;
  string *psVar13;
  cmGlobalGenerator *this;
  ostream *poVar14;
  size_t sVar15;
  PolicyID id;
  PolicyID id_00;
  MessageType t;
  _Alloc_hider __s;
  uint uVar16;
  ulong uVar17;
  char *pcVar18;
  string_view value;
  string_view value_00;
  bool system;
  cmExecutionStatus *local_2a8;
  undefined4 local_29c;
  string fname;
  string m;
  string fname_abs;
  cmAlphaNum local_238;
  string listFile;
  string resultVarName;
  string local_1c8;
  ostringstream e;
  
  if ((cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::DeprecatedModules_abi_cxx11_ == '\0') &&
     (iVar10 = __cxa_guard_acquire(&cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                    ::DeprecatedModules_abi_cxx11_), iVar10 != 0)) {
    cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
    ::DeprecatedModules_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
    ::DeprecatedModules_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
    ::DeprecatedModules_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
          ::DeprecatedModules_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header;
    cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
    ::DeprecatedModules_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
          ::DeprecatedModules_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header;
    cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
    ::DeprecatedModules_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    __cxa_atexit(std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>_>
                 ::~map,&cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::DeprecatedModules_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::DeprecatedModules_abi_cxx11_);
  }
  if (cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
      ::DeprecatedModules_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"Documentation",(allocator<char> *)&local_238);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>_>
              ::operator[](&cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                            ::DeprecatedModules_abi_cxx11_,(key_type *)&e);
    *pmVar11 = CMP0106;
    std::__cxx11::string::~string((string *)&e);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"WriteCompilerDetectionHeader",(allocator<char> *)&local_238);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>_>
              ::operator[](&cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                            ::DeprecatedModules_abi_cxx11_,(key_type *)&e);
    *pmVar11 = CMP0120;
    std::__cxx11::string::~string((string *)&e);
  }
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar2 == pbVar1 || 0x80 < (ulong)((long)pbVar2 - (long)pbVar1)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"called with wrong number of arguments.  include() only takes one file."
               ,(allocator<char> *)&local_238);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&e);
    return false;
  }
  local_2a8 = status;
  std::__cxx11::string::string((string *)&fname,(string *)pbVar1);
  resultVarName._M_dataplus._M_p = (pointer)&resultVarName.field_2;
  resultVarName._M_string_length = 0;
  resultVarName.field_2._M_local_buf[0] = '\0';
  uVar17 = 1;
  local_29c = 0;
  bVar8 = false;
  while( true ) {
    uVar16 = (uint)uVar17;
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar17)
    break;
    bVar5 = std::operator==(pbVar1 + uVar17,"OPTIONAL");
    if (bVar5) {
      bVar5 = !bVar8;
      bVar8 = true;
      if (bVar5) goto LAB_0023872f;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&e,"called with invalid arguments: OPTIONAL used twice",
                 (allocator<char> *)&local_238);
      std::__cxx11::string::_M_assign((string *)&local_2a8->Error);
LAB_00238902:
      psVar13 = (string *)&e;
LAB_0023890a:
      std::__cxx11::string::~string((string *)psVar13);
      bVar5 = false;
      goto LAB_00238dc4;
    }
    bVar5 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar17,"RESULT_VARIABLE");
    if (bVar5) {
      if (resultVarName._M_string_length == 0) {
        uVar16 = uVar16 + 1;
        if ((ulong)uVar16 <
            (ulong)((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 5)) {
          std::__cxx11::string::_M_assign((string *)&resultVarName);
          goto LAB_0023872f;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&e,"called with no value for RESULT_VARIABLE.",
                   (allocator<char> *)&local_238);
        std::__cxx11::string::_M_assign((string *)&local_2a8->Error);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&e,"called with invalid arguments: only one result variable allowed",
                   (allocator<char> *)&local_238);
        std::__cxx11::string::_M_assign((string *)&local_2a8->Error);
      }
      goto LAB_00238902;
    }
    bVar5 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar17,"NO_POLICY_SCOPE");
    if (!bVar5) {
      if (uVar16 < 2) goto LAB_0023872f;
      _e = &DAT_0000001e;
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_238.View_._M_str = pbVar1[uVar17]._M_dataplus._M_p;
      local_238.View_._M_len = pbVar1[uVar17]._M_string_length;
      cmStrCat<>(&fname_abs,(cmAlphaNum *)&e,&local_238);
      std::__cxx11::string::_M_assign((string *)&local_2a8->Error);
      psVar13 = &fname_abs;
      goto LAB_0023890a;
    }
    local_29c = (undefined4)CONCAT71(extraout_var,1);
LAB_0023872f:
    uVar17 = (ulong)(uVar16 + 1);
  }
  if (fname._M_string_length == 0) {
    pcVar3 = local_2a8->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"include() given empty file name (ignored).",
               (allocator<char> *)&local_238);
    cmMakefile::IssueMessage(pcVar3,AUTHOR_WARNING,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    bVar5 = true;
    goto LAB_00238dc4;
  }
  bVar5 = cmsys::SystemTools::FileIsFullPath(&fname);
  pcVar4 = local_2a8;
  if (!bVar5) {
    system = false;
    _e = (pointer)fname._M_string_length;
    local_238.View_._M_len = (size_t)&DAT_00000006;
    local_238.View_._M_str = ".cmake";
    cmStrCat<>(&fname_abs,(cmAlphaNum *)&e,&local_238);
    cmMakefile::GetModulesFile(&listFile,pcVar4->Makefile,&fname_abs,&system);
    if ((system == true) &&
       (iVar12 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>_>
                 ::find(&cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::DeprecatedModules_abi_cxx11_._M_t,&fname),
       (_Rb_tree_header *)iVar12._M_node !=
       &cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
        ::DeprecatedModules_abi_cxx11_._M_t._M_impl.super__Rb_tree_header)) {
      PVar9 = cmMakefile::GetPolicyStatus(pcVar4->Makefile,iVar12._M_node[2]._M_color,false);
      if (PVar9 - NEW < 3) {
        std::__cxx11::string::assign((char *)&listFile);
      }
      else if (PVar9 == WARN) {
        pcVar3 = pcVar4->Makefile;
        cmPolicies::GetPolicyWarning_abi_cxx11_
                  (&local_1c8,(cmPolicies *)(ulong)iVar12._M_node[2]._M_color,id);
        _e = (pointer)local_1c8._M_string_length;
        local_238.View_._M_len = (size_t)&DAT_00000001;
        local_238.View_._M_str = "\n";
        cmStrCat<>(&m,(cmAlphaNum *)&e,&local_238);
        cmMakefile::IssueMessage(pcVar3,AUTHOR_WARNING,&m);
        std::__cxx11::string::~string((string *)&m);
        std::__cxx11::string::~string((string *)&local_1c8);
      }
    }
    if (listFile._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&fname);
    }
    std::__cxx11::string::~string((string *)&listFile);
    std::__cxx11::string::~string((string *)&fname_abs);
  }
  psVar13 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(pcVar4->Makefile);
  cmsys::SystemTools::CollapseFullPath(&fname_abs,&fname,psVar13);
  this = cmMakefile::GetGlobalGenerator(pcVar4->Makefile);
  bVar5 = cmGlobalGenerator::IsExportedTargetsFile(this,&fname_abs);
  if (bVar5) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    PVar9 = cmMakefile::GetPolicyStatus(pcVar4->Makefile,CMP0024,false);
    if (2 < PVar9 - NEW) {
      if (PVar9 == WARN) {
        cmPolicies::GetPolicyWarning_abi_cxx11_
                  ((string *)&local_238,(cmPolicies *)&DAT_00000018,id_00);
        poVar14 = std::operator<<((ostream *)&e,(string *)&local_238);
        std::operator<<(poVar14,"\n");
        std::__cxx11::string::~string((string *)&local_238);
        bVar5 = false;
        pcVar18 = "should";
        t = AUTHOR_WARNING;
        goto LAB_00238aea;
      }
LAB_00238b85:
      cmGlobalGenerator::CreateGenerationObjects(this,AllTargets);
      cmGlobalGenerator::GenerateImportFile(this,&fname_abs);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      goto LAB_00238ba9;
    }
    t = FATAL_ERROR;
    bVar5 = true;
    pcVar18 = "may";
LAB_00238aea:
    poVar14 = std::operator<<((ostream *)&e,"The file\n  ");
    poVar14 = std::operator<<(poVar14,(string *)&fname_abs);
    poVar14 = std::operator<<(poVar14,"\nwas generated by the export() command.  It ");
    poVar14 = std::operator<<(poVar14,pcVar18);
    std::operator<<(poVar14,
                    " not be used as the argument to the include() command.  Use ALIAS targets instead to refer to targets by alternative names.\n"
                   );
    pcVar3 = pcVar4->Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar3,t,(string *)&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    if (!bVar5) goto LAB_00238b85;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    bVar5 = false;
  }
  else {
LAB_00238ba9:
    psVar13 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(pcVar4->Makefile);
    cmsys::SystemTools::CollapseFullPath(&listFile,&fname,psVar13);
    bVar6 = cmsys::SystemTools::FileExists(&listFile);
    bVar7 = cmsys::SystemTools::FileIsDirectory(&listFile);
    if (bVar6 && !bVar7) {
LAB_00238c8a:
      bVar6 = cmMakefile::ReadDependentFile(pcVar4->Makefile,&listFile,(bool)((byte)local_29c & 1));
      if (resultVarName._M_string_length != 0) {
        pcVar3 = pcVar4->Makefile;
        __s = fname_abs._M_dataplus;
        if (!bVar6) {
          __s._M_p = "NOTFOUND";
        }
        sVar15 = strlen(__s._M_p);
        value_00._M_str = __s._M_p;
        value_00._M_len = sVar15;
        cmMakefile::AddDefinition(pcVar3,&resultVarName,value_00);
      }
      bVar5 = true;
      if ((!bVar6 && !bVar8) && (bVar8 = cmSystemTools::GetFatalErrorOccurred(), !bVar8)) {
        _e = (pointer)0x21;
        local_238.View_._M_len = fname._M_string_length;
        local_238.View_._M_str = fname._M_dataplus._M_p;
        cmStrCat<>(&m,(cmAlphaNum *)&e,&local_238);
        std::__cxx11::string::_M_assign((string *)&pcVar4->Error);
LAB_00238da1:
        std::__cxx11::string::~string((string *)&m);
        bVar5 = false;
      }
    }
    else {
      if (resultVarName._M_string_length != 0) {
        value._M_str = "NOTFOUND";
        value._M_len = 8;
        cmMakefile::AddDefinition(pcVar4->Makefile,&resultVarName,value);
      }
      bVar5 = true;
      if (!bVar8) {
        if (bVar6) {
          if (!bVar7) goto LAB_00238c8a;
          _e = (pointer)0x21;
          local_238.View_._M_len = fname._M_string_length;
          local_238.View_._M_str = fname._M_dataplus._M_p;
          cmStrCat<>(&m,(cmAlphaNum *)&e,&local_238);
          std::__cxx11::string::_M_assign((string *)&pcVar4->Error);
        }
        else {
          _e = (pointer)0x21;
          local_238.View_._M_len = fname._M_string_length;
          local_238.View_._M_str = fname._M_dataplus._M_p;
          cmStrCat<>(&m,(cmAlphaNum *)&e,&local_238);
          std::__cxx11::string::_M_assign((string *)&pcVar4->Error);
        }
        goto LAB_00238da1;
      }
    }
    std::__cxx11::string::~string((string *)&listFile);
  }
  std::__cxx11::string::~string((string *)&fname_abs);
LAB_00238dc4:
  std::__cxx11::string::~string((string *)&resultVarName);
  std::__cxx11::string::~string((string *)&fname);
  return bVar5;
}

Assistant:

bool cmIncludeCommand(std::vector<std::string> const& args,
                      cmExecutionStatus& status)
{
  static std::map<std::string, cmPolicies::PolicyID> DeprecatedModules;
  if (DeprecatedModules.empty()) {
    DeprecatedModules["Documentation"] = cmPolicies::CMP0106;
    DeprecatedModules["WriteCompilerDetectionHeader"] = cmPolicies::CMP0120;
  }

  if (args.empty() || args.size() > 4) {
    status.SetError("called with wrong number of arguments.  "
                    "include() only takes one file.");
    return false;
  }
  bool optional = false;
  bool noPolicyScope = false;
  std::string fname = args[0];
  std::string resultVarName;

  for (unsigned int i = 1; i < args.size(); i++) {
    if (args[i] == "OPTIONAL") {
      if (optional) {
        status.SetError("called with invalid arguments: OPTIONAL used twice");
        return false;
      }
      optional = true;
    } else if (args[i] == "RESULT_VARIABLE") {
      if (!resultVarName.empty()) {
        status.SetError("called with invalid arguments: "
                        "only one result variable allowed");
        return false;
      }
      if (++i < args.size()) {
        resultVarName = args[i];
      } else {
        status.SetError("called with no value for RESULT_VARIABLE.");
        return false;
      }
    } else if (args[i] == "NO_POLICY_SCOPE") {
      noPolicyScope = true;
    } else if (i > 1) // compat.: in previous cmake versions the second
                      // parameter was ignored if it wasn't "OPTIONAL"
    {
      std::string errorText =
        cmStrCat("called with invalid argument: ", args[i]);
      status.SetError(errorText);
      return false;
    }
  }

  if (fname.empty()) {
    status.GetMakefile().IssueMessage(
      MessageType::AUTHOR_WARNING,
      "include() given empty file name (ignored).");
    return true;
  }

  if (!cmSystemTools::FileIsFullPath(fname)) {
    bool system = false;
    // Not a path. Maybe module.
    std::string module = cmStrCat(fname, ".cmake");
    std::string mfile = status.GetMakefile().GetModulesFile(module, system);

    if (system) {
      auto ModulePolicy = DeprecatedModules.find(fname);
      if (ModulePolicy != DeprecatedModules.end()) {
        cmPolicies::PolicyStatus PolicyStatus =
          status.GetMakefile().GetPolicyStatus(ModulePolicy->second);
        switch (PolicyStatus) {
          case cmPolicies::WARN: {
            status.GetMakefile().IssueMessage(
              MessageType::AUTHOR_WARNING,
              cmStrCat(cmPolicies::GetPolicyWarning(ModulePolicy->second),
                       "\n"));
            CM_FALLTHROUGH;
          }
          case cmPolicies::OLD:
            break;
          case cmPolicies::REQUIRED_IF_USED:
          case cmPolicies::REQUIRED_ALWAYS:
          case cmPolicies::NEW:
            mfile = "";
            break;
        }
      }
    }

    if (!mfile.empty()) {
      fname = mfile;
    }
  }

  std::string fname_abs = cmSystemTools::CollapseFullPath(
    fname, status.GetMakefile().GetCurrentSourceDirectory());

  cmGlobalGenerator* gg = status.GetMakefile().GetGlobalGenerator();
  if (gg->IsExportedTargetsFile(fname_abs)) {
    const char* modal = nullptr;
    std::ostringstream e;
    MessageType messageType = MessageType::AUTHOR_WARNING;

    switch (status.GetMakefile().GetPolicyStatus(cmPolicies::CMP0024)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0024) << "\n";
        modal = "should";
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::NEW:
        modal = "may";
        messageType = MessageType::FATAL_ERROR;
    }
    if (modal) {
      e << "The file\n  " << fname_abs
        << "\nwas generated by the export() "
           "command.  It "
        << modal
        << " not be used as the argument to the "
           "include() command.  Use ALIAS targets instead to refer to targets "
           "by alternative names.\n";
      status.GetMakefile().IssueMessage(messageType, e.str());
      if (messageType == MessageType::FATAL_ERROR) {
        return false;
      }
    }
    gg->CreateGenerationObjects();
    gg->GenerateImportFile(fname_abs);
  }

  std::string listFile = cmSystemTools::CollapseFullPath(
    fname, status.GetMakefile().GetCurrentSourceDirectory());

  const bool fileDoesnotExist = !cmSystemTools::FileExists(listFile);
  const bool fileIsDirectory = cmSystemTools::FileIsDirectory(listFile);
  if (fileDoesnotExist || fileIsDirectory) {
    if (!resultVarName.empty()) {
      status.GetMakefile().AddDefinition(resultVarName, "NOTFOUND");
    }
    if (optional) {
      return true;
    }
    if (fileDoesnotExist) {
      status.SetError(cmStrCat("could not find requested file:\n  ", fname));
      return false;
    }
    if (fileIsDirectory) {
      status.SetError(cmStrCat("requested file is a directory:\n  ", fname));
      return false;
    }
  }

  bool readit =
    status.GetMakefile().ReadDependentFile(listFile, noPolicyScope);

  // add the location of the included file if a result variable was given
  if (!resultVarName.empty()) {
    status.GetMakefile().AddDefinition(
      resultVarName, readit ? fname_abs.c_str() : "NOTFOUND");
  }

  if (!optional && !readit && !cmSystemTools::GetFatalErrorOccurred()) {
    std::string m = cmStrCat("could not load requested file:\n  ", fname);
    status.SetError(m);
    return false;
  }
  return true;
}